

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int selectOpNegated(int c)

{
  int iVar1;
  
  iVar1 = 0;
  if (c - 0x66U < 6) {
    iVar1 = *(int *)(&DAT_001093d0 + (ulong)(c - 0x66U) * 4);
  }
  return iVar1;
}

Assistant:

procedure
int selectOpNegated(int c) {
	variable int riscOp;
	riscOp=0;
	if (c == SYMBOL_EQUALTEST) {
		riscOp = RISC_BNE;
	} elsif (c == SYMBOL_LESS) {
		riscOp = RISC_BGE;
	} elsif (c == SYMBOL_GREATER) {
		riscOp = RISC_BLE;
	} elsif (c == SYMBOL_LEQ) {
		riscOp = RISC_BGT;
	} elsif (c == SYMBOL_GEQ) {
		riscOp = RISC_BLT;
	} elsif (c == SYMBOL_NOT) {
		riscOp = RISC_BEQ;
	}
	return riscOp;
}